

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_set_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 in_RDI;
  gost_grasshopper_cipher_ctx_ctr *ctr;
  uchar *in_stack_00000020;
  ASN1_TYPE *in_stack_00000028;
  undefined4 local_4;
  
  uVar2 = EVP_CIPHER_CTX_get0_cipher(in_RDI);
  iVar1 = EVP_CIPHER_get_mode(uVar2);
  if (iVar1 == 5) {
    lVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    *(undefined4 *)(lVar3 + 0x1a8) = 0x40000;
    EVP_CIPHER_CTX_original_iv(in_RDI);
    local_4 = gost2015_set_asn1_params
                        (in_stack_00000028,in_stack_00000020,(size_t)ctx,(uchar *)params);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gost_grasshopper_set_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    if (EVP_CIPHER_CTX_mode(ctx) == EVP_CIPH_CTR_MODE) {
        gost_grasshopper_cipher_ctx_ctr *ctr = EVP_CIPHER_CTX_get_cipher_data(ctx);

        /* CMS implies 256kb section_size */
        ctr->section_size = 256*1024;

        return gost2015_set_asn1_params(params,
               EVP_CIPHER_CTX_original_iv(ctx), 8, ctr->kdf_seed);
    }
    return 0;
}